

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::GenerateUtf8CheckCodeForString
          (cpp *this,FieldDescriptor *field,Options *options,bool for_parse,string_view parameters,
          Formatter *format)

{
  string_view strict_function;
  string_view verify_function;
  undefined7 in_register_00000009;
  string_view params;
  
  params._M_len._1_7_ = in_register_00000009;
  params._M_len._0_1_ = for_parse;
  strict_function._M_str = "VerifyUtf8String";
  strict_function._M_len = 0x10;
  verify_function._M_str = "VerifyUTF8StringNamedField";
  verify_function._M_len = 0x1a;
  params._M_str = (char *)parameters._M_len;
  GenerateUtf8CheckCode
            (*(Printer **)parameters._M_str,(FieldDescriptor *)this,(Options *)field,
             SUB81(options,0),params,strict_function,verify_function);
  return;
}

Assistant:

void GenerateUtf8CheckCodeForString(const FieldDescriptor* field,
                                    const Options& options, bool for_parse,
                                    absl::string_view parameters,
                                    const Formatter& format) {
  GenerateUtf8CheckCode(format.printer(), field, options, for_parse, parameters,
                        "VerifyUtf8String", "VerifyUTF8StringNamedField");
}